

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali-query.cpp
# Opt level: O0

void setup_caliper_config(Args *args)

{
  Args *this;
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  Args *local_10;
  Args *args_local;
  
  local_10 = args;
  cali_config_preset("CALI_LOG_VERBOSITY","0");
  cali_config_preset("CALI_CALIPER_ATTRIBUTE_DEFAULT_SCOPE","process");
  cali_config_allow_read_env(0);
  cali_config_set("CALI_CONFIG_FILE","cali-query_caliper.config");
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"verbose",&local_31);
  bVar1 = cali::util::Args::is_set(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (bVar1) {
    cali_config_preset("CALI_LOG_VERBOSITY","1");
  }
  return;
}

Assistant:

void setup_caliper_config(const Args& args)
{
    //   Configure the default config, which can be provided by the user through
    // the "cali-query_caliper.config" file or the "caliper-config" command line arg

    cali_config_preset("CALI_LOG_VERBOSITY", "0");
    cali_config_preset("CALI_CALIPER_ATTRIBUTE_DEFAULT_SCOPE", "process");

    cali_config_allow_read_env(false);
    cali_config_set("CALI_CONFIG_FILE", "cali-query_caliper.config");

    if (args.is_set("verbose"))
        cali_config_preset("CALI_LOG_VERBOSITY", "1");
}